

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O1

void __thiscall
OnDiskIterator::pop(OnDiskIterator *this,int count,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  uint64_t uVar3;
  string next;
  ifstream reader;
  path local_278;
  long local_238 [4];
  byte abStack_218 [488];
  
  DatabaseName::get_full_path_abi_cxx11_(&local_278,&this->datafile_name);
  std::ifstream::ifstream(local_238,local_278._M_pathname._M_dataplus._M_p,_S_bin);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_278);
  std::istream::seekg((istream *)local_238,this->byte_offset,0);
  if (0 < count) {
    paVar1 = &local_278._M_pathname.field_2;
    while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
      local_278._M_pathname._M_string_length = 0;
      local_278._M_pathname.field_2._M_local_buf[0] = '\0';
      local_278._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar2);
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_278._M_pathname._M_dataplus._M_p,
                          CONCAT71(local_278._M_pathname.field_2._M_allocated_capacity._1_7_,
                                   local_278._M_pathname.field_2._M_local_buf[0]) + 1);
        }
        break;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
                 &local_278._M_pathname);
      this->file_offset = this->file_offset + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_278._M_pathname._M_dataplus._M_p,
                        CONCAT71(local_278._M_pathname.field_2._M_allocated_capacity._1_7_,
                                 local_278._M_pathname.field_2._M_local_buf[0]) + 1);
      }
      count = count + -1;
      if (count == 0) break;
    }
  }
  uVar3 = std::istream::tellg();
  this->byte_offset = uVar3;
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void OnDiskIterator::pop(int count, std::vector<std::string> *out) {
    std::ifstream reader(datafile_name.get_full_path(), std::ios_base::binary);
    reader.seekg(byte_offset);

    for (int i = 0; i < count && !reader.eof(); i++) {
        std::string next;
        std::getline(reader, next);
        if (reader.eof()) {
            break;
        }
        out->emplace_back(next);
        file_offset += 1;
    }
    byte_offset = reader.tellg();
}